

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O3

void tf::detail::
     insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
               (string *begin,string *end)

{
  int iVar1;
  string *psVar2;
  long lVar3;
  string *psVar4;
  string *psVar5;
  long lVar6;
  T tmp;
  string *local_50;
  undefined8 local_48;
  long local_40;
  undefined8 uStack_38;
  
  if ((begin != end) && (begin + 0x20 != end)) {
    lVar3 = 0;
    psVar5 = begin + 0x20;
    psVar4 = begin;
    do {
      psVar2 = psVar5;
      iVar1 = std::__cxx11::string::compare(psVar2);
      if (iVar1 < 0) {
        psVar5 = psVar4 + 0x30;
        if (*(string **)psVar2 == psVar5) {
          local_40 = *(long *)psVar5;
          uStack_38 = *(undefined8 *)(psVar4 + 0x38);
          local_50 = (string *)&local_40;
        }
        else {
          local_40 = *(long *)psVar5;
          local_50 = *(string **)psVar2;
        }
        local_48 = *(undefined8 *)(psVar4 + 0x28);
        *(string **)psVar2 = psVar5;
        *(undefined8 *)(psVar4 + 0x28) = 0;
        psVar4[0x30] = (string)0x0;
        lVar6 = lVar3;
        do {
          std::__cxx11::string::operator=(psVar4 + 0x20,psVar4);
          psVar5 = begin;
          if (lVar6 == 0) break;
          iVar1 = std::__cxx11::string::compare((string *)&local_50);
          lVar6 = lVar6 + 0x20;
          psVar5 = psVar4;
          psVar4 = psVar4 + -0x20;
        } while (iVar1 < 0);
        std::__cxx11::string::operator=(psVar5,(string *)&local_50);
        if (local_50 != (string *)&local_40) {
          operator_delete(local_50,local_40 + 1);
        }
      }
      lVar3 = lVar3 + -0x20;
      psVar5 = psVar2 + 0x20;
      psVar4 = psVar2;
    } while (psVar2 + 0x20 != end);
  }
  return;
}

Assistant:

void insertion_sort(RandItr begin, RandItr end, Compare comp) {

  using T = typename std::iterator_traits<RandItr>::value_type;

  if (begin == end) {
    return;
  }

  for (RandItr cur = begin + 1; cur != end; ++cur) {

    RandItr shift = cur;
    RandItr shift_1 = cur - 1;

    // Compare first to avoid 2 moves for an element
    // already positioned correctly.
    if (comp(*shift, *shift_1)) {
      T tmp = std::move(*shift);
      do {
        *shift-- = std::move(*shift_1);
      }while (shift != begin && comp(tmp, *--shift_1));
      *shift = std::move(tmp);
    }
  }
}